

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O0

void __thiscall duckdb::MetadataBlock::FreeBlocksFromInteger(MetadataBlock *this,idx_t free_list)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ulong in_RSI;
  long in_RDI;
  idx_t mask;
  idx_t index;
  idx_t i;
  value_type_conflict4 *in_stack_ffffffffffffffb8;
  undefined8 local_18;
  
  vector<unsigned_char,_true>::clear((vector<unsigned_char,_true> *)0xac0ec1);
  if (in_RSI != 0) {
    for (local_18 = 0x40; local_18 != 0; local_18 = local_18 + -1) {
      if ((in_RSI & 1L << ((byte)(local_18 - 1U) & 0x3f)) != 0) {
        this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x18);
        UnsafeNumericCast<unsigned_char,unsigned_long,void>(local_18 - 1U);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (this_00,in_stack_ffffffffffffffb8);
      }
    }
  }
  return;
}

Assistant:

void MetadataBlock::FreeBlocksFromInteger(idx_t free_list) {
	free_blocks.clear();
	if (free_list == 0) {
		return;
	}
	for (idx_t i = 64; i > 0; i--) {
		auto index = i - 1;
		idx_t mask = idx_t(1) << index;
		if (free_list & mask) {
			free_blocks.push_back(UnsafeNumericCast<uint8_t>(index));
		}
	}
}